

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckInputScripts(CTransaction *tx,TxValidationState *state,CCoinsViewCache *inputs,uint flags,
                      bool cacheSigStore,bool cacheFullScriptStore,
                      PrecomputedTransactionData *txdata,ValidationCache *validation_cache,
                      vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks)

{
  string *debug_message;
  long lVar1;
  pointer pCVar2;
  uint256 e;
  bool bVar3;
  bool bVar4;
  CSHA256 *pCVar5;
  CTxOut *__args;
  long lVar6;
  PrecomputedTransactionData *args;
  uint nInIn;
  ulong uVar7;
  ValidationCache *pVVar8;
  byte bVar9;
  pointer outpoint;
  long in_FS_OFFSET;
  byte bVar10;
  undefined7 uVar11;
  allocator<char> local_1cd;
  uint flags_local;
  undefined1 local_1c8 [96];
  CScriptCheck check2;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  ScriptError local_dc;
  CSHA256 hasher;
  uint256 hashCacheEntry;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags_local = flags;
  bVar3 = CTransaction::IsCoinBase(tx);
  bVar9 = 1;
  if (!bVar3) {
    if (pvChecks != (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
                (pvChecks,((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x68);
    }
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pVVar8 = validation_cache;
    pCVar5 = &hasher;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pCVar5->s = *(undefined8 *)(pVVar8->m_script_execution_cache_hasher).s;
      pVVar8 = (ValidationCache *)((long)pVVar8 + (ulong)bVar10 * -0x10 + 8);
      pCVar5 = (CSHA256 *)((long)pCVar5 + (ulong)bVar10 * -0x10 + 8);
    }
    pCVar5 = CSHA256::Write(&hasher,(uchar *)&tx->m_witness_hash,0x20);
    pCVar5 = CSHA256::Write(pCVar5,(uchar *)&flags_local,4);
    CSHA256::Finalize(pCVar5,(uchar *)&hashCacheEntry);
    bVar3 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&validation_cache->m_script_execution_cache,&hashCacheEntry,
                       !cacheFullScriptStore);
    if (bVar3) {
LAB_0035fd46:
      bVar9 = 1;
    }
    else {
      pVVar8 = validation_cache;
      if (txdata->m_spent_outputs_ready == false) {
        spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
                  (&spent_outputs,
                   ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x68);
        pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pVVar8 = (ValidationCache *)&spent_outputs;
        for (outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start; outpoint != pCVar2;
            outpoint = outpoint + 1) {
          __args = &CCoinsViewCache::AccessCoin(inputs,&outpoint->prevout)->out;
          if (__args->nValue == -1) {
            __assert_fail("!coin.IsSpent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x875,
                          "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                         );
          }
          std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                    ((vector<CTxOut,std::allocator<CTxOut>> *)pVVar8,__args);
        }
        PrecomputedTransactionData::Init<CTransaction>(txdata,tx,&spent_outputs,false);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&spent_outputs);
      }
      if (((long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x28 !=
          ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x68) {
        __assert_fail("txdata.m_spent_outputs.size() == tx.vin.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x87a,
                      "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                     );
      }
      nInIn = 0;
      do {
        uVar7 = (ulong)nInIn;
        if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= uVar7) {
          if (pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0 &&
              cacheFullScriptStore) {
            uVar11 = hashCacheEntry.super_base_blob<256U>.m_data._M_elems._17_7_;
            e.super_base_blob<256U>.m_data._M_elems[8] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[8];
            e.super_base_blob<256U>.m_data._M_elems[9] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[9];
            e.super_base_blob<256U>.m_data._M_elems[10] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[10];
            e.super_base_blob<256U>.m_data._M_elems[0xb] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xb];
            e.super_base_blob<256U>.m_data._M_elems[0xc] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xc];
            e.super_base_blob<256U>.m_data._M_elems[0xd] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xd];
            e.super_base_blob<256U>.m_data._M_elems[0xe] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xe];
            e.super_base_blob<256U>.m_data._M_elems[0xf] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0xf];
            e.super_base_blob<256U>.m_data._M_elems[0] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0];
            e.super_base_blob<256U>.m_data._M_elems[1] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[1];
            e.super_base_blob<256U>.m_data._M_elems[2] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[2];
            e.super_base_blob<256U>.m_data._M_elems[3] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[3];
            e.super_base_blob<256U>.m_data._M_elems[4] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[4];
            e.super_base_blob<256U>.m_data._M_elems[5] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[5];
            e.super_base_blob<256U>.m_data._M_elems[6] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[6];
            e.super_base_blob<256U>.m_data._M_elems[7] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[7];
            e.super_base_blob<256U>.m_data._M_elems[0x10] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x10];
            e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)uVar11;
            e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((uint7)uVar11 >> 8);
            e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((uint7)uVar11 >> 0x10);
            e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((uint7)uVar11 >> 0x18);
            e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((uint7)uVar11 >> 0x20);
            e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((uint7)uVar11 >> 0x28);
            e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((uint7)uVar11 >> 0x30);
            e.super_base_blob<256U>.m_data._M_elems[0x18] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x18];
            e.super_base_blob<256U>.m_data._M_elems[0x19] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x19];
            e.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1a];
            e.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1b];
            e.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1c];
            e.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1d];
            e.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1e];
            e.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 hashCacheEntry.super_base_blob<256U>.m_data._M_elems[0x1f];
            CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                      (&validation_cache->m_script_execution_cache,e);
          }
          goto LAB_0035fd46;
        }
        args = txdata;
        CScriptCheck::CScriptCheck
                  ((CScriptCheck *)&spent_outputs,
                   (txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar7,tx,
                   &validation_cache->m_signature_cache,nInIn,flags_local,cacheSigStore,txdata);
        if (pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
          bVar4 = CScriptCheck::operator()((CScriptCheck *)&spent_outputs);
          bVar3 = true;
          if (!bVar4) {
            if ((flags_local & 0x1df1ca) == 0) {
LAB_0035fc71:
              ScriptErrorString_abi_cxx11_((string *)(local_1c8 + 0x40),local_dc);
              tinyformat::format<std::__cxx11::string>
                        ((string *)&check2,(tinyformat *)"mandatory-script-verify-flag-failed (%s)",
                         (char *)(local_1c8 + 0x40),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              debug_message = (string *)(local_1c8 + 0x20);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)debug_message,"",(allocator<char> *)local_1c8);
              bVar3 = ValidationState<TxValidationResult>::Invalid
                                (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                 (string *)&check2,debug_message);
              pVVar8 = (ValidationCache *)(ulong)bVar3;
              std::__cxx11::string::~string((string *)debug_message);
              std::__cxx11::string::~string((string *)&check2);
              std::__cxx11::string::~string((string *)(local_1c8 + 0x40));
            }
            else {
              args = txdata;
              CScriptCheck::CScriptCheck
                        (&check2,(txdata->m_spent_outputs).
                                 super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar7,tx,
                         &validation_cache->m_signature_cache,nInIn,flags_local & 0xffe20e35,
                         cacheSigStore,txdata);
              bVar3 = CScriptCheck::operator()(&check2);
              if (bVar3) {
                ScriptErrorString_abi_cxx11_((string *)(local_1c8 + 0x20),local_dc);
                tinyformat::format<std::__cxx11::string>
                          ((string *)(local_1c8 + 0x40),
                           (tinyformat *)"non-mandatory-script-verify-flag (%s)",
                           (char *)(local_1c8 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                args = (PrecomputedTransactionData *)local_1c8;
                std::__cxx11::string::string<std::allocator<char>>((string *)args,"",&local_1cd);
                bVar4 = ValidationState<TxValidationResult>::Invalid
                                  (&state->super_ValidationState<TxValidationResult>,TX_NOT_STANDARD
                                   ,(string *)(local_1c8 + 0x40),(string *)args);
                pVVar8 = (ValidationCache *)(ulong)bVar4;
                std::__cxx11::string::~string((string *)local_1c8);
                std::__cxx11::string::~string((string *)(local_1c8 + 0x40));
                std::__cxx11::string::~string((string *)(local_1c8 + 0x20));
              }
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        (&check2.m_tx_out.scriptPubKey.super_CScriptBase);
              if (!bVar3) goto LAB_0035fc71;
            }
            bVar3 = false;
          }
        }
        else {
          bVar3 = true;
          std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::emplace_back<CScriptCheck>
                    (pvChecks,(CScriptCheck *)&spent_outputs);
        }
        bVar9 = (byte)pVVar8;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        nInIn = nInIn + 1;
      } while (bVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool CheckInputScripts(const CTransaction& tx, TxValidationState& state,
                       const CCoinsViewCache& inputs, unsigned int flags, bool cacheSigStore,
                       bool cacheFullScriptStore, PrecomputedTransactionData& txdata,
                       ValidationCache& validation_cache,
                       std::vector<CScriptCheck>* pvChecks)
{
    if (tx.IsCoinBase()) return true;

    if (pvChecks) {
        pvChecks->reserve(tx.vin.size());
    }

    // First check if script executions have been cached with the same
    // flags. Note that this assumes that the inputs provided are
    // correct (ie that the transaction hash which is in tx's prevouts
    // properly commits to the scriptPubKey in the inputs view of that
    // transaction).
    uint256 hashCacheEntry;
    CSHA256 hasher = validation_cache.ScriptExecutionCacheHasher();
    hasher.Write(UCharCast(tx.GetWitnessHash().begin()), 32).Write((unsigned char*)&flags, sizeof(flags)).Finalize(hashCacheEntry.begin());
    AssertLockHeld(cs_main); //TODO: Remove this requirement by making CuckooCache not require external locks
    if (validation_cache.m_script_execution_cache.contains(hashCacheEntry, !cacheFullScriptStore)) {
        return true;
    }

    if (!txdata.m_spent_outputs_ready) {
        std::vector<CTxOut> spent_outputs;
        spent_outputs.reserve(tx.vin.size());

        for (const auto& txin : tx.vin) {
            const COutPoint& prevout = txin.prevout;
            const Coin& coin = inputs.AccessCoin(prevout);
            assert(!coin.IsSpent());
            spent_outputs.emplace_back(coin.out);
        }
        txdata.Init(tx, std::move(spent_outputs));
    }
    assert(txdata.m_spent_outputs.size() == tx.vin.size());

    for (unsigned int i = 0; i < tx.vin.size(); i++) {

        // We very carefully only pass in things to CScriptCheck which
        // are clearly committed to by tx' witness hash. This provides
        // a sanity check that our caching is not introducing consensus
        // failures through additional data in, eg, the coins being
        // spent being checked as a part of CScriptCheck.

        // Verify signature
        CScriptCheck check(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i, flags, cacheSigStore, &txdata);
        if (pvChecks) {
            pvChecks->emplace_back(std::move(check));
        } else if (!check()) {
            if (flags & STANDARD_NOT_MANDATORY_VERIFY_FLAGS) {
                // Check whether the failure was caused by a
                // non-mandatory script verification check, such as
                // non-standard DER encodings or non-null dummy
                // arguments; if so, ensure we return NOT_STANDARD
                // instead of CONSENSUS to avoid downstream users
                // splitting the network between upgraded and
                // non-upgraded nodes by banning CONSENSUS-failing
                // data providers.
                CScriptCheck check2(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i,
                        flags & ~STANDARD_NOT_MANDATORY_VERIFY_FLAGS, cacheSigStore, &txdata);
                if (check2())
                    return state.Invalid(TxValidationResult::TX_NOT_STANDARD, strprintf("non-mandatory-script-verify-flag (%s)", ScriptErrorString(check.GetScriptError())));
            }
            // MANDATORY flag failures correspond to
            // TxValidationResult::TX_CONSENSUS. Because CONSENSUS
            // failures are the most serious case of validation
            // failures, we may need to consider using
            // RECENT_CONSENSUS_CHANGE for any script failure that
            // could be due to non-upgraded nodes which we may want to
            // support, to avoid splitting the network (but this
            // depends on the details of how net_processing handles
            // such errors).
            return state.Invalid(TxValidationResult::TX_CONSENSUS, strprintf("mandatory-script-verify-flag-failed (%s)", ScriptErrorString(check.GetScriptError())));
        }
    }

    if (cacheFullScriptStore && !pvChecks) {
        // We executed all of the provided scripts, and were told to
        // cache the result. Do so now.
        validation_cache.m_script_execution_cache.insert(hashCacheEntry);
    }

    return true;
}